

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgrenderstate.cpp
# Opt level: O0

void __thiscall lunasvg::SVGRenderState::endGroup(SVGRenderState *this,SVGBlendInfo *blendInfo)

{
  bool bVar1;
  shared_ptr<lunasvg::Canvas> *__b;
  SVGClipPathElement *pSVar2;
  SVGMaskElement *pSVar3;
  element_type *peVar4;
  element_type *canvas;
  float local_34;
  float opacity;
  SVGBlendInfo *blendInfo_local;
  SVGRenderState *this_local;
  
  __b = SVGRenderState::canvas(this->m_parent);
  bVar1 = std::operator==(&this->m_canvas,__b);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_canvas);
    Canvas::restore(peVar4);
  }
  else {
    if (this->m_mode == Clipping) {
      local_34 = 1.0;
    }
    else {
      local_34 = SVGBlendInfo::opacity(blendInfo);
    }
    pSVar2 = SVGBlendInfo::clipper(blendInfo);
    if (pSVar2 != (SVGClipPathElement *)0x0) {
      pSVar2 = SVGBlendInfo::clipper(blendInfo);
      SVGClipPathElement::applyClipMask(pSVar2,this);
    }
    if (this->m_mode == Painting) {
      pSVar3 = SVGBlendInfo::masker(blendInfo);
      if (pSVar3 != (SVGMaskElement *)0x0) {
        pSVar3 = SVGBlendInfo::masker(blendInfo);
        SVGMaskElement::applyMask(pSVar3,this);
      }
    }
    peVar4 = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_parent->m_canvas);
    canvas = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_canvas);
    Canvas::blendCanvas(peVar4,canvas,Src_Over,local_34);
  }
  return;
}

Assistant:

void SVGRenderState::endGroup(const SVGBlendInfo& blendInfo)
{
    if(m_canvas == m_parent->canvas()) {
        m_canvas->restore();
        return;
    }

    auto opacity = m_mode == SVGRenderMode::Clipping ? 1.f : blendInfo.opacity();
    if(blendInfo.clipper())
        blendInfo.clipper()->applyClipMask(*this);
    if(m_mode == SVGRenderMode::Painting && blendInfo.masker()) {
        blendInfo.masker()->applyMask(*this);
    }

    m_parent->m_canvas->blendCanvas(*m_canvas, BlendMode::Src_Over, opacity);
}